

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStoreFactoryTestCase.cpp
# Opt level: O2

void __thiscall
SuiteFileStoreFactoryTests::callCreateFixture::callCreateFixture(callCreateFixture *this)

{
  allocator<char> local_71;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"store",&local_71);
  FIX::FileStoreFactory::FileStoreFactory(&this->object,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"FS",(allocator<char> *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"FACT",&local_71);
  FIX::deleteSession(&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

callCreateFixture() : object( "store" )
  {
    deleteSession( "FS", "FACT" );
  }